

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O1

int hydro_hash_init(hydro_hash_state *state,char *ctx,uint8_t *key)

{
  undefined8 uVar1;
  size_t in_len;
  undefined4 local_48;
  undefined2 uStack_44;
  undefined2 uStack_42;
  undefined6 uStack_40;
  undefined2 uStack_3a;
  undefined1 uStack_38;
  undefined7 uStack_37;
  undefined1 uStack_30;
  undefined7 uStack_2f;
  undefined1 uStack_28;
  undefined7 uStack_27;
  undefined1 uStack_20;
  undefined5 uStack_1f;
  undefined2 uStack_1a;
  undefined1 uStack_18;
  undefined7 uStack_17;
  undefined8 uStack_10;
  
  local_48 = 0x616d6b04;
  uStack_44 = 0x863;
  uStack_3a = 0;
  uStack_37 = SUB327(ZEXT432(0) << 0x40,3);
  uStack_30 = 0;
  uStack_2f = SUB327(ZEXT432(0),3);
  uStack_28 = 0;
  uStack_27 = 0;
  uStack_20 = 0;
  uStack_1f = 0;
  uStack_1a = 0;
  uStack_18 = 0;
  uStack_17 = 0;
  uStack_10 = 0;
  uStack_42 = (undefined2)*(undefined8 *)ctx;
  uStack_40 = (undefined6)((ulong)*(undefined8 *)ctx >> 0x10);
  if (key == (uint8_t *)0x0) {
    uStack_38 = 0;
    in_len = 0x20;
  }
  else {
    uStack_38 = 0x20;
    uVar1 = *(undefined8 *)(key + 0x18);
    uStack_37 = (undefined7)*(undefined8 *)key;
    uStack_30 = (undefined1)((ulong)*(undefined8 *)key >> 0x38);
    uStack_2f = (undefined7)*(undefined8 *)(key + 8);
    uStack_28 = (undefined1)((ulong)*(undefined8 *)(key + 8) >> 0x38);
    uStack_27 = (undefined7)*(undefined8 *)(key + 0x10);
    uStack_20 = (undefined1)((ulong)*(undefined8 *)(key + 0x10) >> 0x38);
    uStack_1f = (undefined5)uVar1;
    uStack_1a = (undefined2)((ulong)uVar1 >> 0x28);
    uStack_18 = (undefined1)((ulong)uVar1 >> 0x38);
    in_len = 0x40;
  }
  state->state[5] = 0;
  state->state[6] = 0;
  state->state[7] = 0;
  state->state[8] = 0;
  state->state[9] = 0;
  state->state[10] = 0;
  *(undefined8 *)(state->state + 0xb) = 0;
  state->state[0] = 0;
  state->state[1] = 0;
  state->state[2] = 0;
  state->state[3] = 0;
  state->state[4] = 0;
  state->state[5] = 0;
  state->state[6] = 0;
  state->state[7] = 0;
  hydro_hash_update(state,&local_48,in_len);
  return 0;
}

Assistant:

int
hydro_hash_init(hydro_hash_state *state, const char ctx[hydro_hash_CONTEXTBYTES],
                const uint8_t key[hydro_hash_KEYBYTES])
{
    uint8_t block[64] = { 4, 'k', 'm', 'a', 'c', 8 };
    size_t  p;

    COMPILER_ASSERT(hydro_hash_KEYBYTES <= sizeof block - gimli_RATE - 1);
    COMPILER_ASSERT(hydro_hash_CONTEXTBYTES == 8);
    mem_zero(block + 14, sizeof block - 14);
    memcpy(block + 6, ctx, 8);
    if (key != NULL) {
        block[gimli_RATE] = (uint8_t) hydro_hash_KEYBYTES;
        memcpy(block + gimli_RATE + 1, key, hydro_hash_KEYBYTES);
        p = (gimli_RATE + 1 + hydro_hash_KEYBYTES + (gimli_RATE - 1)) & ~(size_t) (gimli_RATE - 1);
    } else {
        block[gimli_RATE] = (uint8_t) 0;
        p                 = (gimli_RATE + 1 + 0 + (gimli_RATE - 1)) & ~(size_t) (gimli_RATE - 1);
    }
    mem_zero(state, sizeof *state);
    hydro_hash_update(state, block, p);

    return 0;
}